

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_cte.cpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalMaterializedCTE *op)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  idx_t *__k;
  ClientContext *__args;
  pointer prVar1;
  reference pvVar2;
  pointer pLVar3;
  mapped_type *this_01;
  mapped_type *pmVar4;
  type pLVar5;
  PhysicalOperator *pPVar6;
  PhysicalOperator *args_4;
  pointer this_02;
  PhysicalCTE *pPVar7;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  *__x;
  shared_ptr<duckdb::ColumnDataCollection,_true> working_table;
  undefined1 local_51;
  shared_ptr<duckdb::ColumnDataCollection,_true> local_50;
  ColumnDataCollection *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  __args = this->context;
  this_00 = &(op->super_LogicalOperator).children;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,0);
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar2);
  local_40 = (ColumnDataCollection *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&>
            (&local_38,&local_40,(allocator<duckdb::ColumnDataCollection> *)&local_51,__args,
             &pLVar3->types);
  local_50.internal.super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_40;
  local_50.internal.super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_38._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_38._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00f303f9;
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
LAB_00f303f9:
  __k = &op->table_index;
  this_01 = ::std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->recursive_cte_tables,__k);
  shared_ptr<duckdb::ColumnDataCollection,_true>::operator=(this_01,&local_50);
  pmVar4 = ::std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->materialized_ctes,__k);
  prVar1 = (pmVar4->
           super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
           ).
           super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (pmVar4->
  super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ).
  super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar4->
  super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ).
  super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar4->
  super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ).
  super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (prVar1 != (pointer)0x0) {
    operator_delete(prVar1);
  }
  pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,0);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar2);
  pPVar6 = CreatePlan(this,pLVar5);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,1);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar2);
  args_4 = CreatePlan(this,pLVar5);
  this_02 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
            operator->(&this->physical_plan);
  pPVar6 = PhysicalPlan::
           Make<duckdb::PhysicalCTE,std::__cxx11::string&,unsigned_long&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,unsigned_long&>
                     (this_02,&op->ctename,__k,&args_4->types,pPVar6,args_4,
                      &(op->super_LogicalOperator).estimated_cardinality);
  pPVar7 = PhysicalOperator::Cast<duckdb::PhysicalCTE>(pPVar6);
  shared_ptr<duckdb::ColumnDataCollection,_true>::operator=(&pPVar7->working_table,&local_50);
  __x = &::std::__detail::
         _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
         ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&this->materialized_ctes,__k)->
         super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ;
  ::std::
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ::operator=(&(pPVar7->cte_scans).
               super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
              ,__x);
  if (local_50.internal.super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.internal.
               super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return pPVar6;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalMaterializedCTE &op) {
	D_ASSERT(op.children.size() == 2);

	// Create the working_table that the PhysicalCTE will use for evaluation.
	auto working_table = make_shared_ptr<ColumnDataCollection>(context, op.children[0]->types);

	// Add the ColumnDataCollection to the context of this PhysicalPlanGenerator
	recursive_cte_tables[op.table_index] = working_table;
	materialized_ctes[op.table_index] = vector<const_reference<PhysicalOperator>>();

	// Create the plan for the left side. This is the materialization.
	auto &left = CreatePlan(*op.children[0]);
	// Initialize an empty vector to collect the scan operators.
	auto &right = CreatePlan(*op.children[1]);

	auto &cte = Make<PhysicalCTE>(op.ctename, op.table_index, right.types, left, right, op.estimated_cardinality);
	auto &cast_cte = cte.Cast<PhysicalCTE>();
	cast_cte.working_table = working_table;
	cast_cte.cte_scans = materialized_ctes[op.table_index];
	return cte;
}